

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseDirectDeclaratorSuffix
          (Parser *this,DeclaratorSyntax **decltor,DeclarationContext declCtx,
          DeclaratorForm decltorForm,SpecifierListSyntax *attrList,DeclaratorSyntax *innerDecltor)

{
  SyntaxKind SVar1;
  DeclaratorSyntax *pDVar2;
  ParameterDeclarationListSyntax *pPVar3;
  bool bVar4;
  int iVar5;
  SyntaxToken *pSVar6;
  ParameterSuffixSyntax *pPVar7;
  IndexType IVar8;
  ArrayOrFunctionDeclaratorSyntax *pAVar9;
  undefined4 extraout_var;
  SubscriptSuffixSyntax *pSVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined4 extraout_var_00;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar12;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **specList;
  ParameterSuffixSyntax *funcDecltorSfx;
  size_type __dnew;
  string local_68;
  SpecifierListSyntax *local_48;
  SyntaxTree *local_40;
  ParameterDeclarationListSyntax *local_38;
  
  pSVar6 = peek(this,1);
  if (pSVar6->syntaxK_ == OpenBracketToken) {
    local_48 = (SpecifierListSyntax *)decltor;
    pSVar10 = makeNode<psy::C::SubscriptSuffixSyntax>(this);
    IVar8 = consume(this);
    pSVar10->openBracketTkIdx_ = IVar8;
    pSVar6 = peek(this,1);
    SVar1 = pSVar6->syntaxK_;
    if (SVar1 < ENDof_KeywordOrPunctuatorToken) {
      if (SVar1 < KeywordAlias___restrict) {
        if (SVar1 == CloseBracketToken) goto LAB_002b7e85;
        if (SVar1 != KeywordAlias___const) goto LAB_002b7e71;
LAB_002b7c58:
        bVar4 = operator<((this->tree_->dialect_).std_,C99);
        if (bVar4) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_38 = (ParameterDeclarationListSyntax *)0x58;
          local_40 = (SyntaxTree *)innerDecltor;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_38);
          pPVar3 = local_38;
          local_68.field_2._M_allocated_capacity = (size_type)local_38;
          local_68._M_dataplus._M_p = (pointer)paVar11;
          memcpy(paVar11,
                 "C99 array declarators with `*\', `static\', and type-qualifiers within function parameters"
                 ,0x58);
          local_68._M_string_length = (size_type)pPVar3;
          paVar11->_M_local_buf[(long)pPVar3] = '\0';
          DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_68);
          innerDecltor = (DeclaratorSyntax *)local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            innerDecltor = (DeclaratorSyntax *)local_40;
          }
        }
        if (declCtx != Parameter) goto LAB_002b7f57;
        bVar4 = parseTypeQualifiersAndAttributes(this,&pSVar10->qualsAndAttrs1_);
        if (bVar4) {
          pSVar6 = peek(this,1);
          if (pSVar6->syntaxK_ != Keyword_static) {
            if (pSVar6->syntaxK_ == AsteriskToken) goto LAB_002b7d51;
            goto LAB_002b7e71;
          }
          goto LAB_002b7d62;
        }
      }
      else {
        if (SVar1 == KeywordAlias___restrict) goto LAB_002b7c58;
        if (SVar1 != Keyword_static) goto LAB_002b7e71;
LAB_002b7d62:
        bVar4 = operator<((this->tree_->dialect_).std_,C99);
        if (bVar4) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_38 = (ParameterDeclarationListSyntax *)0x58;
          local_40 = (SyntaxTree *)innerDecltor;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_38);
          pPVar3 = local_38;
          local_68.field_2._M_allocated_capacity = (size_type)local_38;
          local_68._M_dataplus._M_p = (pointer)paVar11;
          memcpy(paVar11,
                 "C99 array declarators with `*\', `static\', and type-qualifiers within function parameters"
                 ,0x58);
          local_68._M_string_length = (size_type)pPVar3;
          paVar11->_M_local_buf[(long)pPVar3] = '\0';
          DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_68);
          innerDecltor = (DeclaratorSyntax *)local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            innerDecltor = (DeclaratorSyntax *)local_40;
          }
        }
        if (declCtx != Parameter) {
LAB_002b7f57:
          DiagnosticsReporter::UnexpectedStaticOrTypeQualifiersInArrayDeclarator
                    (&this->diagReporter_);
          goto LAB_002b7f60;
        }
        IVar8 = consume(this);
        pSVar10->staticKwTkIdx_ = IVar8;
        pSVar6 = peek(this,1);
        SVar1 = pSVar6->syntaxK_;
        if ((((0x3d < (ulong)SVar1) || ((0x2004000400000000U >> ((ulong)SVar1 & 0x3f) & 1) == 0)) &&
            (SVar1 != KeywordAlias___attribute)) ||
           (bVar4 = parseTypeQualifiersAndAttributes(this,&pSVar10->qualsAndAttrs2_), bVar4))
        goto LAB_002b7e71;
      }
    }
    else {
      if (KeywordAlias___alignof < SVar1) {
        if ((SVar1 == Keyword__Atomic) || (SVar1 == KeywordAlias___attribute)) goto LAB_002b7c58;
LAB_002b7e71:
        bVar4 = parseExpressionWithPrecedenceAssignment(this,&pSVar10->expr_);
        if (!bVar4) goto LAB_002b7f6d;
LAB_002b7e85:
        bVar4 = matchOrSkipTo(this,CloseBracketToken,&pSVar10->closeBracketTkIdx_);
        if (!bVar4) {
          return false;
        }
        local_68._M_dataplus._M_p._0_2_ = 0x415;
        pAVar9 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>
                           (this,(SyntaxKind *)&local_68);
        decltor = (DeclaratorSyntax **)local_48;
        *(ArrayOrFunctionDeclaratorSyntax **)local_48 = pAVar9;
        iVar5 = (*(pAVar9->super_DeclaratorSyntax).super_SyntaxNode.super_Managed._vptr_Managed
                  [0x56])(pAVar9);
        *(SubscriptSuffixSyntax **)(CONCAT44(extraout_var_00,iVar5) + 0x28) = pSVar10;
        local_48 = attrList;
        goto LAB_002b7ed0;
      }
      if (SVar1 == ENDof_KeywordOrPunctuatorToken) goto LAB_002b7c58;
      if (SVar1 != AsteriskToken) goto LAB_002b7e71;
      bVar4 = operator<((this->tree_->dialect_).std_,C99);
      if (bVar4) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "C99 array declarators with `*\', `static\', and type-qualifiers within function parameters"
                   ,"");
        DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if (declCtx == Parameter) {
LAB_002b7d51:
        IVar8 = consume(this);
        pSVar10->asteriskTkIdx_ = IVar8;
        goto LAB_002b7e85;
      }
      DiagnosticsReporter::UnexpectedPointerInArrayDeclarator(&this->diagReporter_);
LAB_002b7f60:
      skipTo(this,CloseBracketToken);
    }
LAB_002b7f6d:
    skipTo(this,CloseBracketToken);
  }
  else {
    if (pSVar6->syntaxK_ != OpenParenToken) {
      return true;
    }
    local_48 = attrList;
    pPVar7 = makeNode<psy::C::ParameterSuffixSyntax>(this);
    local_68._M_dataplus._M_p = (pointer)pPVar7;
    IVar8 = consume(this);
    pPVar7->openParenTkIdx_ = IVar8;
    bVar4 = parseParameterDeclarationListAndOrEllipsis(this,(ParameterSuffixSyntax **)&local_68);
    if (!bVar4) {
      return false;
    }
    bVar4 = match(this,CloseParenToken,&pPVar7->closeParenTkIdx_);
    if (!bVar4) {
      return false;
    }
    pSVar6 = peek(this,1);
    if (pSVar6->syntaxK_ == Keyword_ExtPSY_omission) {
      IVar8 = consume(this);
      pPVar7->psyOmitTkIdx_ = IVar8;
    }
    local_38 = (ParameterDeclarationListSyntax *)CONCAT62(local_38._2_6_,0x416);
    pAVar9 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>
                       (this,(SyntaxKind *)&local_38);
    *decltor = &pAVar9->super_DeclaratorSyntax;
    iVar5 = (*(pAVar9->super_DeclaratorSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0x56])
                      (pAVar9);
    *(ParameterSuffixSyntax **)(CONCAT44(extraout_var,iVar5) + 0x28) = pPVar7;
LAB_002b7ed0:
    pDVar2 = *decltor;
    pDVar2[1].super_SyntaxNode.super_Managed._vptr_Managed = (_func_int **)local_48;
    pDVar2[1].super_SyntaxNode.tree_ = (SyntaxTree *)innerDecltor;
    specList = (SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **)(pDVar2 + 2);
    local_48 = (SpecifierListSyntax *)decltor;
    pSVar6 = peek(this,1);
    if (pSVar6->syntaxK_ != KeywordAlias___attribute) {
      if (pSVar6->syntaxK_ != KeywordAlias___asm) goto LAB_002b7fa2;
      local_68._M_dataplus._M_p = (pointer)0x0;
      bVar4 = parseExtGNU_AsmLabel_AtFirst(this,(SpecifierSyntax **)&local_68);
      if (!bVar4) {
        return false;
      }
      pSVar12 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                          (this,(SpecifierSyntax **)&local_68);
      *specList = pSVar12;
      pSVar6 = peek(this,1);
      if (pSVar6->syntaxK_ != KeywordAlias___attribute) goto LAB_002b7fa2;
      specList = &(pSVar12->
                  super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  ).
                  super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  .next;
    }
    bVar4 = parseExtGNU_AttributeSpecifierList_AtFirst(this,specList);
    if (bVar4) {
LAB_002b7fa2:
      pSVar6 = peek(this,1);
      if ((pSVar6->syntaxK_ != OpenParenToken) && (pSVar6->syntaxK_ != OpenBracketToken)) {
        return true;
      }
      bVar4 = parseDirectDeclaratorSuffix
                        (this,(DeclaratorSyntax **)local_48,declCtx,decltorForm,
                         (SpecifierListSyntax *)0x0,*(DeclaratorSyntax **)local_48);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool Parser::parseDirectDeclaratorSuffix(DeclaratorSyntax*& decltor,
                                         DeclarationContext declCtx,
                                         DeclaratorForm decltorForm,
                                         SpecifierListSyntax* attrList,
                                         DeclaratorSyntax* innerDecltor)
{
    auto validateContext =
            [this, declCtx] (void (Parser::DiagnosticsReporter::*report)()) {
                if (declCtx != DeclarationContext::Parameter) {
                    ((diagReporter_).*(report))();
                    skipTo(SyntaxKind::CloseBracketToken);
                    return false;
                }
                return true;
            };

    auto checkDialect =
            [this] () {
                if (tree_->dialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.ExpectedFeature(
                            "C99 array declarators with `*', `static', and type-qualifiers "
                            "within function parameters");
                }
            };

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            auto funcDecltorSfx = makeNode<ParameterSuffixSyntax>();
            funcDecltorSfx->openParenTkIdx_ = consume();
            if (!parseParameterDeclarationListAndOrEllipsis(funcDecltorSfx)
                    || !match(SyntaxKind::CloseParenToken, &funcDecltorSfx->closeParenTkIdx_))
                return false;

            if (peek().kind() == SyntaxKind::Keyword_ExtPSY_omission)
                funcDecltorSfx->psyOmitTkIdx_ = consume();

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::FunctionDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = funcDecltorSfx;
            break;
        }

        case SyntaxKind::OpenBracketToken: {
            auto arrDecltorSx = makeNode<SubscriptSuffixSyntax>();
            arrDecltorSx->openBracketTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::CloseBracketToken:
                    break;

                case SyntaxKind::AsteriskToken:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedPointerInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    arrDecltorSx->asteriskTkIdx_ = consume();
                    break;

                case SyntaxKind::Keyword_const:
                case SyntaxKind::Keyword_volatile:
                case SyntaxKind::Keyword_restrict:
                case SyntaxKind::Keyword__Atomic:
                case SyntaxKind::Keyword_ExtGNU___attribute__: {
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)
                            || !parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs1_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    auto tkK = peek().kind();
                    if (tkK == SyntaxKind::AsteriskToken) {
                        arrDecltorSx->asteriskTkIdx_ = consume();
                        break;
                    }
                    else if (tkK != SyntaxKind::Keyword_static) {
                        if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                            skipTo(SyntaxKind::CloseBracketToken);
                            return false;
                        }
                        break;
                    }
                    [[fallthrough]];
                }

                case SyntaxKind::Keyword_static:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    arrDecltorSx->staticKwTkIdx_ = consume();
                    switch (peek().kind()) {
                        case SyntaxKind::Keyword_const:
                        case SyntaxKind::Keyword_volatile:
                        case SyntaxKind::Keyword_restrict:
                        case SyntaxKind::Keyword_ExtGNU___attribute__:
                            if (!parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs2_)) {
                                skipTo(SyntaxKind::CloseBracketToken);
                                return false;
                            }
                            [[fallthrough]];

                        default:
                            break;
                    }
                    [[fallthrough]];

                default:
                    if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    break;
            }

            if (!matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDecltorSx->closeBracketTkIdx_))
                return false;

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::ArrayDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = arrDecltorSx;
            break;
        }

        default:
            return true;
    }

    auto arrayOrFuncDecltor = static_cast<ArrayOrFunctionDeclaratorSyntax*>(decltor);
    arrayOrFuncDecltor->attrs1_ = attrList;
    arrayOrFuncDecltor->innerDecltor_ = innerDecltor;

    SpecifierListSyntax** specList_cur = &arrayOrFuncDecltor->attrs2_;

    switch (peek().kind()) {
        case SyntaxKind::Keyword_ExtGNU___asm__: {
            SpecifierSyntax* spec = nullptr;
            if (!parseExtGNU_AsmLabel_AtFirst(spec))
                return false;

            *specList_cur = makeNode<SpecifierListSyntax>(spec);
            specList_cur = &(*specList_cur)->next;

            if (peek().kind() != SyntaxKind::Keyword_ExtGNU___attribute__)
                break;
            [[fallthrough]];
        }

        case SyntaxKind::Keyword_ExtGNU___attribute__:
            if (!parseExtGNU_AttributeSpecifierList_AtFirst(*specList_cur))
                return false;
            break;

        default:
            break;
    }

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken:
        case SyntaxKind::OpenBracketToken: {
            innerDecltor = decltor;
            return parseDirectDeclaratorSuffix(decltor,
                                               declCtx,
                                               decltorForm,
                                               nullptr,
                                               innerDecltor);
        }

        default:
            return true;
    }

    return true;
}